

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

uint16_t nettlp_msg_get_dev_id(in_addr addr)

{
  int __fd;
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint16_t devid;
  int req;
  pollfd x [1];
  uint16_t local_16;
  undefined4 local_14;
  pollfd local_10;
  
  __fd = nettlp_msg_socket(addr);
  if (0 < __fd) {
    local_14 = 2;
    write(__fd,&local_14,4);
    local_10.events = 1;
    local_10.fd = __fd;
    iVar1 = poll(&local_10,1,500);
    if (iVar1 == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0x3e;
    }
    else {
      sVar2 = read(__fd,&local_16,2);
      if (-1 < (int)sVar2) {
        close(__fd);
        return local_16;
      }
    }
    close(__fd);
  }
  return 0;
}

Assistant:

uint16_t nettlp_msg_get_dev_id(struct in_addr addr)
{
	int sock, req, ret = 0;
	uint16_t devid;
	struct pollfd x[1];

	sock = nettlp_msg_socket(addr);
	if (sock < 1)
		return 0;

	/* send GET_BAR4 request */
	req = NETTLP_MSG_GET_DEV_ID;
	ret = write(sock, &req, sizeof(req));

	/* recv response with timeout */
	x[0].fd = sock;
	x[0].events = POLLIN;

	ret = poll(x, 1, LIBTLP_CPL_TIMEOUT);
	if (ret == 0) {
		errno = ETIME;
		goto err_out;
	}

	ret = read(sock, &devid, sizeof(devid));
	if (ret < 0)
		goto err_out;

	close(sock);
	return devid;

err_out:
	close(sock);
	return 0;
}